

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O2

CURLcode Curl_input_digest(Curl_easy *data,_Bool proxy,char *header)

{
  int iVar1;
  CURLcode CVar2;
  byte *chlg;
  undefined7 in_register_00000031;
  
  iVar1 = curl_strnequal("Digest",header,6);
  if (iVar1 != 0) {
    iVar1 = Curl_isspace((uint)(byte)header[6]);
    if (iVar1 != 0) {
      for (chlg = (byte *)(header + 6); *chlg != 0; chlg = chlg + 1) {
        iVar1 = Curl_isspace((uint)*chlg);
        if (iVar1 == 0) break;
      }
      CVar2 = Curl_auth_decode_digest_http_message
                        ((char *)chlg,
                         (digestdata *)
                         ((long)&(data->state).digest.nonce +
                         (ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 6)));
      return CVar2;
    }
  }
  return CURLE_BAD_CONTENT_ENCODING;
}

Assistant:

CURLcode Curl_input_digest(struct Curl_easy *data,
                           bool proxy,
                           const char *header) /* rest of the *-authenticate:
                                                  header */
{
  /* Point to the correct struct with this */
  struct digestdata *digest;

  if(proxy) {
    digest = &data->state.proxydigest;
  }
  else {
    digest = &data->state.digest;
  }

  if(!checkprefix("Digest", header) || !ISSPACE(header[6]))
    return CURLE_BAD_CONTENT_ENCODING;

  header += strlen("Digest");
  while(*header && ISSPACE(*header))
    header++;

  return Curl_auth_decode_digest_http_message(header, digest);
}